

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messageboxbutton.cpp
# Opt level: O0

void __thiscall
QtMWidgets::MsgBoxButton::MsgBoxButton(MsgBoxButton *this,QString *text,QWidget *parent)

{
  MsgBoxButtonPrivate *this_00;
  MsgBoxButtonPrivate *this_01;
  Object local_60 [8];
  code *local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 local_40;
  Object local_38 [24];
  QWidget *local_20;
  QWidget *parent_local;
  QString *text_local;
  MsgBoxButton *this_local;
  
  local_20 = parent;
  parent_local = (QWidget *)text;
  text_local = (QString *)this;
  QAbstractButton::QAbstractButton(&this->super_QAbstractButton,parent);
  *(undefined ***)this = &PTR_metaObject_00234668;
  *(undefined ***)&this->field_0x10 = &PTR__MsgBoxButton_00234830;
  this_00 = (MsgBoxButtonPrivate *)operator_new(0x28);
  MsgBoxButtonPrivate::MsgBoxButtonPrivate(this_00,(QString *)parent_local,this);
  QScopedPointer<QtMWidgets::MsgBoxButtonPrivate,_QScopedPointerDeleter<QtMWidgets::MsgBoxButtonPrivate>_>
  ::QScopedPointer(&this->d,this_00);
  this_01 = QScopedPointer<QtMWidgets::MsgBoxButtonPrivate,_QScopedPointerDeleter<QtMWidgets::MsgBoxButtonPrivate>_>
            ::operator->(&this->d);
  MsgBoxButtonPrivate::init(this_01,(EVP_PKEY_CTX *)this_00);
  local_48 = QAbstractButton::pressed;
  local_40 = 0;
  local_58 = _q_pressed;
  uStack_50 = 0;
  QObject::connect<void(QAbstractButton::*)(),void(QtMWidgets::MsgBoxButton::*)()>
            (local_38,(offset_in_QAbstractButton_to_subr)this,(Object *)QAbstractButton::pressed,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_38);
  QObject::connect<void(QAbstractButton::*)(),void(QtMWidgets::MsgBoxButton::*)()>
            (local_60,(offset_in_QAbstractButton_to_subr)this,(Object *)QAbstractButton::released,0,
             (ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  return;
}

Assistant:

MsgBoxButton::MsgBoxButton( const QString & text, QWidget * parent )
	:	QAbstractButton( parent )
	,	d( new MsgBoxButtonPrivate( text, this ) )
{
	d->init();

	connect( this, &QAbstractButton::pressed,
		this, &MsgBoxButton::_q_pressed );

	connect( this, &QAbstractButton::released,
		this, &MsgBoxButton::_q_released );
}